

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_cpdbcc(m68k_info *info)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  cs_m68k *pcVar5;
  
  if ((info->type & 0x1c) != 0) {
    uVar3 = read_imm_16(info);
    uVar4 = read_imm_16(info);
    puVar1 = &info->inst->Opcode;
    *puVar1 = *puVar1 + (uVar3 & 0x2f);
    pcVar5 = build_init_op(info,0x82,2,0);
    pcVar5->operands[0].field_0.reg = (info->ir & 7) + M68K_REG_D0;
    pcVar5->operands[1].type = M68K_OP_BR_DISP;
    pcVar5->operands[1].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
    pcVar5->operands[1].br_disp.disp = (uint)(uVar4 < 0x8000) * 0x10000 + uVar4 + -0xfffe;
    pcVar5->operands[1].br_disp.disp_size = '\x02';
    bVar2 = info->groups_count;
    info->groups_count = bVar2 + 1;
    info->groups[bVar2] = '\x01';
    bVar2 = info->groups_count;
    info->groups_count = bVar2 + 1;
    info->groups[bVar2] = '\a';
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_cpdbcc(m68k_info *info)
{
	cs_m68k* ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	uint ext1, ext2;

	LIMIT_CPU_TYPES(info, M68020_PLUS);

	ext1 = read_imm_16(info);
	ext2 = read_imm_16(info);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (ext1 & 0x2f);

	ext = build_init_op(info, M68K_INS_FDBF, 2, 0);
	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->reg = M68K_REG_D0 + (info->ir & 7);

	make_cpbcc_operand(op1, M68K_OP_BR_DISP_SIZE_WORD, make_int_16(ext2) + 2);

	set_insn_group(info, M68K_GRP_JUMP);
	set_insn_group(info, M68K_GRP_BRANCH_RELATIVE);
}